

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.c++
# Opt level: O1

void __thiscall
capnp::compiler::LineBreakTable::LineBreakTable(LineBreakTable *this,ArrayPtr<const_char> content)

{
  RemoveConst<unsigned_int> *pRVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  RemoveConst<unsigned_int> RVar5;
  size_t newSize;
  char *pcVar6;
  char *pos;
  char *pcVar7;
  
  uVar4 = content.size_;
  pcVar7 = content.ptr;
  puVar3 = (uint *)kj::_::HeapArrayDisposer::allocateImpl
                             (4,0,uVar4 / 0x28,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                             );
  (this->lineBreaks).builder.ptr = puVar3;
  (this->lineBreaks).builder.pos = puVar3;
  (this->lineBreaks).builder.endPtr = puVar3 + uVar4 / 0x28;
  (this->lineBreaks).builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  if (uVar4 < 0x28) {
    kj::Vector<unsigned_int>::setCapacity(&this->lineBreaks,4);
  }
  pRVar1 = (this->lineBreaks).builder.pos;
  *pRVar1 = 0;
  (this->lineBreaks).builder.pos = pRVar1 + 1;
  if (0 < (long)uVar4) {
    pcVar6 = pcVar7 + uVar4;
    RVar5 = 1;
    do {
      if (*pcVar7 == '\n') {
        puVar3 = (this->lineBreaks).builder.endPtr;
        if ((this->lineBreaks).builder.pos == puVar3) {
          puVar2 = (this->lineBreaks).builder.ptr;
          newSize = (long)puVar3 - (long)puVar2 >> 1;
          if (puVar3 == puVar2) {
            newSize = 4;
          }
          kj::Vector<unsigned_int>::setCapacity(&this->lineBreaks,newSize);
        }
        pRVar1 = (this->lineBreaks).builder.pos;
        *pRVar1 = RVar5;
        (this->lineBreaks).builder.pos = pRVar1 + 1;
      }
      pcVar7 = pcVar7 + 1;
      RVar5 = RVar5 + 1;
    } while (pcVar7 < pcVar6);
  }
  return;
}

Assistant:

LineBreakTable::LineBreakTable(kj::ArrayPtr<const char> content)
    : lineBreaks(content.size() / 40) {
  lineBreaks.add(0);
  for (const char* pos = content.begin(); pos < content.end(); ++pos) {
    if (*pos == '\n') {
      lineBreaks.add(pos + 1 - content.begin());
    }
  }
}